

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_fkhash_nlm.hpp
# Opt level: O3

value_type_conflict7 * __thiscall
poplar::plain_fkhash_nlm<int>::append(plain_fkhash_nlm<int> *this,char_range *key)

{
  ulong __n;
  uchar *puVar1;
  uint8_t *puVar2;
  uchar *puVar3;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> __s;
  long lVar4;
  long lVar5;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_40;
  uint8_t *local_38;
  
  local_38 = key->begin;
  puVar2 = key->end;
  lVar5 = (long)puVar2 - (long)local_38;
  __n = lVar5 + 4;
  __s.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)operator_new__(__n)
  ;
  memset((void *)__s.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,__n);
  local_40._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       __s.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,std::allocator<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>>>
  ::emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>>
            ((vector<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,std::allocator<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>>>
              *)this,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_40
            );
  if ((_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
      local_40._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0) {
    operator_delete__((void *)local_40._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  }
  this->label_bytes_ = this->label_bytes_ + __n;
  puVar3 = (this->ptrs_).
           super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (puVar2 != local_38) {
    puVar2 = key->begin;
    lVar4 = 0;
    do {
      puVar3[lVar4] = puVar2[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
  }
  puVar1 = puVar3 + lVar5;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  return (value_type_conflict7 *)(puVar3 + lVar5);
}

Assistant:

value_type* append(const char_range& key) {
        uint64_t length = key.length();
        ptrs_.emplace_back(std::make_unique<uint8_t[]>(length + sizeof(value_type)));
        label_bytes_ += length + sizeof(value_type);

        auto ptr = ptrs_.back().get();
        copy_bytes(ptr, key.begin, length);

#ifdef POPLAR_EXTRA_STATS
        max_length_ = std::max(max_length_, length);
        sum_length_ += length;
#endif

        auto ret = reinterpret_cast<value_type*>(ptr + length);
        *ret = static_cast<value_type>(0);

        return ret;
    }